

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O3

void __thiscall SkipList::reset(SkipList *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  pointer pcVar3;
  Node *pNVar4;
  
  pNVar4 = this->head;
  while (pNVar4 != (Node *)0x0) {
    this->head = pNVar4->down;
    do {
      pNVar2 = pNVar4->right;
      pcVar3 = (pNVar4->value)._M_dataplus._M_p;
      paVar1 = &(pNVar4->value).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      operator_delete(pNVar4,0x38);
      pNVar4 = pNVar2;
    } while (pNVar2 != (Node *)0x0);
    pNVar4 = this->head;
  }
  pNVar4 = (Node *)operator_new(0x38);
  pNVar4->right = (Node *)0x0;
  pNVar4->down = (Node *)0x0;
  pNVar4->key = 0;
  (pNVar4->value)._M_dataplus._M_p = (pointer)&(pNVar4->value).field_2;
  (pNVar4->value)._M_string_length = 0;
  (pNVar4->value).field_2._M_local_buf[0] = '\0';
  this->head = pNVar4;
  this->length = 0;
  this->valueSize = 0;
  return;
}

Assistant:

void SkipList::reset() {
  while (head) {
    Node *t, *p = head;
    head = head->down;
    while (p) {
      t = p->right;
      delete p;
      p = t;
    }
  }
  head = new Node();
  length = 0;
  valueSize = 0;
}